

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_binary_insertion_sort_start(int64_t *dst,size_t start,size_t size)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t iVar12;
  
  if (start < size) {
    uVar6 = start - 2;
    do {
      lVar2 = dst[start];
      if (lVar2 < dst[start - 1]) {
        uVar1 = start - 1;
        uVar5 = uVar6;
        if (lVar2 < *dst) {
          uVar8 = 0;
        }
        else {
          uVar8 = uVar1;
          if (lVar2 <= dst[start - 1]) {
            uVar9 = uVar1 >> 1;
            iVar12 = dst[uVar9];
            uVar10 = 0;
            uVar7 = uVar1;
            do {
              if ((int)lVar2 - (int)iVar12 < 0) {
                uVar4 = uVar9;
                uVar11 = uVar10;
                if (1 < uVar9 - uVar10) goto LAB_0010c14e;
                bVar3 = false;
                uVar8 = uVar9;
              }
              else {
                uVar4 = uVar7;
                uVar11 = uVar9;
                if (uVar7 - uVar9 < 2) {
                  bVar3 = false;
                  uVar8 = uVar9 + 1;
                }
                else {
LAB_0010c14e:
                  uVar7 = uVar4;
                  uVar9 = (uVar7 - uVar11 >> 1) + uVar11;
                  iVar12 = dst[uVar9];
                  bVar3 = true;
                  uVar10 = uVar11;
                }
              }
            } while (bVar3);
          }
        }
        while ((uVar7 = uVar5, uVar8 <= uVar1 &&
               (dst[uVar7 + 2] = dst[uVar7 + 1], uVar7 != 0xffffffffffffffff))) {
          uVar1 = uVar7;
          uVar5 = uVar7 - 1;
        }
        dst[uVar8] = lVar2;
      }
      start = start + 1;
      uVar6 = uVar6 + 1;
    } while (start != size);
  }
  return;
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start,
                                        const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze
     * in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}